

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O2

void Psr_ManBuildNtk(Bac_Ntk_t *pNew,Vec_Ptr_t *vDes,Psr_Ntk_t *pNtk,Vec_Int_t *vMap,
                    Vec_Int_t *vBoxes)

{
  Bac_Man_t *pBVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Bac_ObjType_t Type;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  Psr_Ntk_t *pPVar11;
  char *pcVar12;
  ulong uVar13;
  Bac_Ntk_t *pBVar14;
  char *pcVar15;
  uint uVar16;
  Vec_Int_t *p;
  int local_64;
  uint local_50;
  
  if ((pNtk->vInouts).nSize != 0) {
    __assert_fail("Psr_NtkPioNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                  ,0xa2,
                  "void Psr_ManBuildNtk(Bac_Ntk_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  Psr_ManRemapBoxes(pNew->pDesign,vDes,pNtk,vMap);
  uVar16 = (pNew->vType).nCap;
  if (uVar16 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
  }
  Vec_IntGrow(&pNew->vName,uVar16);
  uVar10 = 0;
  uVar13 = 0;
  if (0 < (int)uVar16) {
    uVar13 = (ulong)uVar16;
  }
  for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    (pNew->vName).pArray[uVar10] = 0;
  }
  (pNew->vName).nSize = uVar16;
  uVar16 = 0;
  while (((int)uVar16 < (pNtk->vInputs).nSize &&
         (iVar2 = Vec_IntEntry(&pNtk->vInputs,uVar16), iVar2 != 0))) {
    iVar3 = Vec_IntEntry(vMap,iVar2);
    if (iVar3 != -1) {
      uVar4 = Vec_IntEntry(vMap,iVar2);
      printf("Primary inputs %d and %d have the same name.\n",(ulong)uVar4,(ulong)uVar16);
    }
    iVar3 = Bac_ObjAlloc(pNew,BAC_OBJ_PI,-1);
    Bac_ObjSetName(pNew,iVar3,iVar2 << 2);
    Vec_IntWriteEntry(vMap,iVar2,iVar3);
    uVar16 = uVar16 + 1;
  }
  vBoxes->nSize = 0;
  iVar2 = 0;
  do {
    iVar3 = (pNtk->vObjs).nSize;
    if (iVar3 <= iVar2) {
      local_64 = -1;
      local_50 = 0;
      for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
        Psr_BoxSignals(pNtk,iVar2);
        iVar3 = Psr_BoxIsNode(pNtk,iVar2);
        if (iVar3 == 0) {
          iVar3 = Psr_BoxNtk(pNtk,iVar2);
          pPVar11 = Psr_ManNtk(vDes,iVar3 + -1);
          iVar3 = Vec_IntEntry(vBoxes,iVar2);
          if (pPVar11 == (Psr_Ntk_t *)0x0) {
            iVar5 = 0;
            for (iVar6 = 0; iVar6 < Psr_BoxSignals::V.nSize + -2; iVar6 = iVar6 + 2) {
              Vec_IntEntry(&Psr_BoxSignals::V,iVar6);
              iVar7 = Vec_IntEntry(&Psr_BoxSignals::V,iVar6 + 1);
              iVar7 = Psr_NtkSigName(pNtk,iVar7);
              iVar8 = Bac_BoxBi(pNew,iVar3,iVar5);
              iVar9 = Vec_IntEntry(vMap,iVar7);
              if (iVar9 == -1) {
                iVar9 = Bac_BoxAlloc(pNew,BAC_BOX_CF,0,1,-1);
                Vec_IntWriteEntry(vMap,iVar7,iVar9 + 1);
                if (local_64 == -1) {
                  local_64 = iVar7;
                }
                local_50 = local_50 + 1;
              }
              iVar7 = Vec_IntEntry(vMap,iVar7);
              Bac_ObjSetFanin(pNew,iVar8,iVar7);
              iVar5 = iVar5 + 1;
            }
          }
          else {
            for (iVar5 = 1; iVar5 + -1 < Psr_BoxSignals::V.nSize; iVar5 = iVar5 + 2) {
              iVar6 = Vec_IntEntry(&Psr_BoxSignals::V,iVar5 + -1);
              if (iVar6 <= (pPVar11->vInputs).nSize) {
                iVar7 = Vec_IntEntry(&Psr_BoxSignals::V,iVar5);
                iVar7 = Psr_NtkSigName(pNtk,iVar7);
                iVar6 = Bac_BoxBi(pNew,iVar3,iVar6 + -1);
                iVar8 = Vec_IntEntry(vMap,iVar7);
                if (iVar8 == -1) {
                  iVar8 = Bac_BoxAlloc(pNew,BAC_BOX_CF,0,1,-1);
                  Vec_IntWriteEntry(vMap,iVar7,iVar8 + 1);
                  if (local_64 == -1) {
                    local_64 = iVar7;
                  }
                  local_50 = local_50 + 1;
                }
                iVar7 = Vec_IntEntry(vMap,iVar7);
                Bac_ObjSetFanin(pNew,iVar6,iVar7);
              }
            }
          }
        }
        else {
          iVar3 = Vec_IntEntry(vBoxes,iVar2);
          iVar6 = 0;
          for (iVar5 = 0; iVar5 < Psr_BoxSignals::V.nSize + -2; iVar5 = iVar5 + 2) {
            Vec_IntEntry(&Psr_BoxSignals::V,iVar5);
            iVar7 = Vec_IntEntry(&Psr_BoxSignals::V,iVar5 + 1);
            iVar7 = Psr_NtkSigName(pNtk,iVar7);
            iVar8 = Bac_BoxBi(pNew,iVar3,iVar6);
            iVar9 = Vec_IntEntry(vMap,iVar7);
            if (iVar9 == -1) {
              iVar9 = Bac_BoxAlloc(pNew,BAC_BOX_CF,0,1,-1);
              Vec_IntWriteEntry(vMap,iVar7,iVar9 + 1);
              if (local_64 == -1) {
                local_64 = iVar7;
              }
              local_50 = local_50 + 1;
            }
            iVar7 = Vec_IntEntry(vMap,iVar7);
            Bac_ObjSetFanin(pNew,iVar8,iVar7);
            iVar6 = iVar6 + 1;
          }
        }
        iVar3 = (pNtk->vObjs).nSize;
      }
      iVar2 = 0;
      while ((iVar2 < (pNtk->vOutputs).nSize &&
             (iVar3 = Vec_IntEntry(&pNtk->vOutputs,iVar2), iVar3 != 0))) {
        iVar5 = Vec_IntEntry(vMap,iVar3);
        if (iVar5 == -1) {
          iVar5 = Bac_BoxAlloc(pNew,BAC_BOX_CF,0,1,-1);
          Vec_IntWriteEntry(vMap,iVar3,iVar5 + 1);
          if (local_64 == -1) {
            local_64 = iVar3;
          }
          local_50 = local_50 + 1;
        }
        iVar2 = iVar2 + 1;
      }
      iVar2 = 0;
      while ((iVar2 < (pNtk->vOutputs).nSize &&
             (iVar3 = Vec_IntEntry(&pNtk->vOutputs,iVar2), iVar3 != 0))) {
        iVar3 = Vec_IntEntry(vMap,iVar3);
        Bac_ObjAlloc(pNew,BAC_OBJ_PO,iVar3);
        iVar2 = iVar2 + 1;
      }
      if (local_50 != 0) {
        pcVar15 = Psr_NtkStr(pNtk,pNtk->iModuleName);
        pcVar12 = Psr_NtkStr(pNtk,local_64);
        printf("Module %s has %d non-driven nets (for example, %s).\n",pcVar15,(ulong)local_50,
               pcVar12);
      }
      Psr_ManCleanMap(pNtk,vMap);
      p = &pNew->vInfo;
      for (iVar2 = 0; iVar2 < (pNtk->vOrder).nSize; iVar2 = iVar2 + 1) {
        iVar3 = Vec_IntEntry(&pNtk->vOrder,iVar2);
        Vec_IntPush(p,iVar3);
        Vec_IntPush(p,-1);
        Vec_IntPush(p,-1);
      }
      return;
    }
    Psr_BoxSignals(pNtk,iVar2);
    iVar3 = Psr_BoxIsNode(pNtk,iVar2);
    Type = Psr_BoxNtk(pNtk,iVar2);
    if (iVar3 == 0) {
      pPVar11 = Psr_ManNtk(vDes,Type - BAC_OBJ_PI);
      if (pPVar11 == (Psr_Ntk_t *)0x0) {
        iVar3 = Psr_BoxSignals::V.nSize / 2;
        iVar5 = Psr_BoxNtk(pNtk,iVar2);
        iVar3 = Bac_BoxAlloc(pNew,BAC_BOX_GATE,iVar3 + -1,1,iVar5);
        iVar5 = Psr_BoxName(pNtk,iVar2);
        Bac_ObjSetName(pNew,iVar3,iVar5 * 4);
        iVar5 = Vec_IntEntryLast(&Psr_BoxSignals::V);
        uVar16 = Psr_NtkSigName(pNtk,iVar5);
        iVar5 = Vec_IntEntry(vMap,uVar16);
        if (iVar5 != -1) {
          pcVar15 = "Box output name %d is already driven.\n";
          goto LAB_00341e96;
        }
        goto LAB_00341e9f;
      }
      iVar3 = (pPVar11->vInputs).nSize;
      iVar5 = (pPVar11->vOutputs).nSize;
      iVar6 = Psr_BoxNtk(pNtk,iVar2);
      iVar3 = Bac_BoxAlloc(pNew,BAC_OBJ_BOX,iVar3,iVar5,iVar6);
      iVar5 = Psr_BoxName(pNtk,iVar2);
      Bac_ObjSetName(pNew,iVar3,iVar5 * 4);
      pBVar1 = pNew->pDesign;
      uVar16 = Psr_BoxNtk(pNtk,iVar2);
      if (((int)uVar16 < 1) || (pBVar1->nNtks < (int)uVar16)) {
        pBVar14 = (Bac_Ntk_t *)0x0;
      }
      else {
        pBVar14 = pBVar1->pNtks + uVar16;
      }
      iVar5 = Bac_NtkId(pNew);
      if (pBVar14->iBoxNtk != -1) {
        __assert_fail("p->iBoxNtk == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0xee,"void Bac_NtkSetHost(Bac_Ntk_t *, int, int)");
      }
      pBVar14->iBoxNtk = iVar5;
      pBVar14->iBoxObj = iVar3;
      for (iVar5 = 1; iVar5 + -1 < Psr_BoxSignals::V.nSize; iVar5 = iVar5 + 2) {
        iVar7 = Vec_IntEntry(&Psr_BoxSignals::V,iVar5 + -1);
        iVar6 = (pPVar11->vInputs).nSize;
        if (iVar6 < iVar7) {
          if ((pPVar11->vOutputs).nSize <= (iVar7 + -1) - iVar6) {
            __assert_fail("Index - Psr_NtkPiNum(pNtkBox) < Psr_NtkPoNum(pNtkBox)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacPrsBuild.c"
                          ,0xcb,
                          "void Psr_ManBuildNtk(Bac_Ntk_t *, Vec_Ptr_t *, Psr_Ntk_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          iVar6 = Vec_IntEntry(&Psr_BoxSignals::V,iVar5);
          uVar16 = Psr_NtkSigName(pNtk,iVar6);
          iVar6 = Vec_IntEntry(vMap,uVar16);
          if (iVar6 != -1) {
            printf("Box output name %d is already driven.\n",(ulong)uVar16);
          }
          iVar6 = Bac_BoxBo(pNew,iVar3,(iVar7 + -1) - (pPVar11->vInputs).nSize);
          Bac_ObjSetName(pNew,iVar6,uVar16 << 2);
          Vec_IntWriteEntry(vMap,uVar16,iVar6);
        }
      }
    }
    else {
      iVar3 = Psr_BoxIONum(pNtk,iVar2);
      iVar3 = Bac_BoxAlloc(pNew,Type,iVar3 + -1,1,-1);
      iVar5 = Vec_IntEntryLast(&Psr_BoxSignals::V);
      uVar16 = Psr_NtkSigName(pNtk,iVar5);
      iVar5 = Vec_IntEntry(vMap,uVar16);
      if (iVar5 != -1) {
        pcVar15 = "Node output name %d is already driven.\n";
LAB_00341e96:
        printf(pcVar15,(ulong)uVar16);
      }
LAB_00341e9f:
      iVar5 = Bac_BoxBo(pNew,iVar3,0);
      Bac_ObjSetName(pNew,iVar5,uVar16 * 4);
      Vec_IntWriteEntry(vMap,uVar16,iVar5);
    }
    Vec_IntPush(vBoxes,iVar3);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

void Psr_ManBuildNtk( Bac_Ntk_t * pNew, Vec_Ptr_t * vDes, Psr_Ntk_t * pNtk, Vec_Int_t * vMap, Vec_Int_t * vBoxes )
{
    Psr_Ntk_t * pNtkBox; Vec_Int_t * vSigs; int iBox;
    int i, Index, NameId, iObj, iConst0, iTerm;
    int iNonDriven = -1, nNonDriven = 0;
    assert( Psr_NtkPioNum(pNtk) == 0 );
    Psr_ManRemapBoxes( pNew->pDesign, vDes, pNtk, vMap );
    Bac_NtkStartNames( pNew );
    // create primary inputs 
    Psr_NtkForEachPi( pNtk, NameId, i )
    {
        if ( Vec_IntEntry(vMap, NameId) != -1 )
            printf( "Primary inputs %d and %d have the same name.\n", Vec_IntEntry(vMap, NameId), i );
        iObj = Bac_ObjAlloc( pNew, BAC_OBJ_PI, -1 );
        Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
        Vec_IntWriteEntry( vMap, NameId, iObj );
    }
    // create box outputs
    Vec_IntClear( vBoxes );
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            pNtkBox = Psr_ManNtk( vDes, Psr_BoxNtk(pNtk, iBox)-1 );
            if ( pNtkBox == NULL )
            {
                iObj = Bac_BoxAlloc( pNew, BAC_BOX_GATE, Vec_IntSize(vSigs)/2-1, 1, Psr_BoxNtk(pNtk, iBox) );
                Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(Psr_BoxName(pNtk, iBox), BAC_NAME_BIN) );
                // consider box output 
                NameId = Vec_IntEntryLast( vSigs );
                NameId = Psr_NtkSigName( pNtk, NameId );
                if ( Vec_IntEntry(vMap, NameId) != -1 )
                    printf( "Box output name %d is already driven.\n", NameId );
                iTerm = Bac_BoxBo( pNew, iObj, 0 );
                Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
                Vec_IntWriteEntry( vMap, NameId, iTerm );
            }
            else
            {
                iObj = Bac_BoxAlloc( pNew, BAC_OBJ_BOX, Psr_NtkPiNum(pNtkBox), Psr_NtkPoNum(pNtkBox), Psr_BoxNtk(pNtk, iBox) );
                Bac_ObjSetName( pNew, iObj, Abc_Var2Lit2(Psr_BoxName(pNtk, iBox), BAC_NAME_BIN) );
                Bac_NtkSetHost( Bac_ManNtk(pNew->pDesign, Psr_BoxNtk(pNtk, iBox)), Bac_NtkId(pNew), iObj );
                Vec_IntForEachEntry( vSigs, Index, i )
                {
                    i++;
                    if ( --Index < Psr_NtkPiNum(pNtkBox) )
                        continue;
                    assert( Index - Psr_NtkPiNum(pNtkBox) < Psr_NtkPoNum(pNtkBox) );
                    // consider box output 
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    if ( Vec_IntEntry(vMap, NameId) != -1 )
                        printf( "Box output name %d is already driven.\n", NameId );
                    iTerm = Bac_BoxBo( pNew, iObj, Index - Psr_NtkPiNum(pNtkBox) );
                    Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
                    Vec_IntWriteEntry( vMap, NameId, iTerm );
                }
            }
            // remember box
            Vec_IntPush( vBoxes, iObj );
        }
        else
        {
            iObj = Bac_BoxAlloc( pNew, (Bac_ObjType_t)Psr_BoxNtk(pNtk, iBox), Psr_BoxIONum(pNtk, iBox)-1, 1, -1 );
            // consider box output 
            NameId = Vec_IntEntryLast( vSigs );
            NameId = Psr_NtkSigName( pNtk, NameId );
            if ( Vec_IntEntry(vMap, NameId) != -1 )
                printf( "Node output name %d is already driven.\n", NameId );
            iTerm = Bac_BoxBo( pNew, iObj, 0 );
            Bac_ObjSetName( pNew, iTerm, Abc_Var2Lit2(NameId, BAC_NAME_BIN) );
            Vec_IntWriteEntry( vMap, NameId, iTerm );
            // remember box
            Vec_IntPush( vBoxes, iObj );
        }
    // add fanins for box inputs
    Psr_NtkForEachBox( pNtk, vSigs, iBox )
        if ( !Psr_BoxIsNode(pNtk, iBox) )
        {
            pNtkBox = Psr_ManNtk( vDes, Psr_BoxNtk(pNtk, iBox)-1 );
            iObj = Vec_IntEntry( vBoxes, iBox );
            if ( pNtkBox == NULL )
            {
                Vec_IntForEachEntryStop( vSigs, Index, i, Vec_IntSize(vSigs)-2 )
                {
                    i++;
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    iTerm = Bac_BoxBi( pNew, iObj, i/2 );
                    if ( Vec_IntEntry(vMap, NameId) == -1 )
                    {
                        iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                        Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                        if ( iNonDriven == -1 )
                            iNonDriven = NameId;
                        nNonDriven++;
                    }
                    Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
                }
            }
            else
            {
                Vec_IntForEachEntry( vSigs, Index, i )
                {
                    i++;
                    if ( --Index >= Psr_NtkPiNum(pNtkBox) )
                        continue;
                    NameId = Vec_IntEntry( vSigs, i );
                    NameId = Psr_NtkSigName( pNtk, NameId );
                    iTerm = Bac_BoxBi( pNew, iObj, Index );
                    if ( Vec_IntEntry(vMap, NameId) == -1 )
                    {
                        iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                        Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                        if ( iNonDriven == -1 )
                            iNonDriven = NameId;
                        nNonDriven++;
                    }
                    Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
                }
            }
        }
        else
        {
            iObj = Vec_IntEntry( vBoxes, iBox );
            Vec_IntForEachEntryStop( vSigs, Index, i, Vec_IntSize(vSigs)-2 )
            {
                NameId = Vec_IntEntry( vSigs, ++i );
                NameId = Psr_NtkSigName( pNtk, NameId );
                iTerm = Bac_BoxBi( pNew, iObj, i/2 );
                if ( Vec_IntEntry(vMap, NameId) == -1 )
                {
                    iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
                    Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
                    if ( iNonDriven == -1 )
                        iNonDriven = NameId;
                    nNonDriven++;
                }
                Bac_ObjSetFanin( pNew, iTerm, Vec_IntEntry(vMap, NameId) );
            }
        }
    // add fanins for primary outputs
    Psr_NtkForEachPo( pNtk, NameId, i )
        if ( Vec_IntEntry(vMap, NameId) == -1 )
        {
            iConst0 = Bac_BoxAlloc( pNew, BAC_BOX_CF, 0, 1, -1 );
            Vec_IntWriteEntry( vMap, NameId, iConst0+1 );
            if ( iNonDriven == -1 )
                iNonDriven = NameId;
            nNonDriven++;
        }
    Psr_NtkForEachPo( pNtk, NameId, i )
        iObj = Bac_ObjAlloc( pNew, BAC_OBJ_PO, Vec_IntEntry(vMap, NameId) );
    if ( nNonDriven )
        printf( "Module %s has %d non-driven nets (for example, %s).\n", Psr_NtkName(pNtk), nNonDriven, Psr_NtkStr(pNtk, iNonDriven) );
    Psr_ManCleanMap( pNtk, vMap );
    // setup info
    Vec_IntForEachEntry( &pNtk->vOrder, NameId, i )
        Bac_NtkAddInfo( pNew, NameId, -1, -1 );
}